

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  BYTE *iEnd;
  int *ilimit_w;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  seqDef *psVar14;
  U32 UVar15;
  uint uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  long lVar19;
  ulong uVar20;
  int *ip;
  int *piVar21;
  U32 UVar22;
  int iVar23;
  BYTE *litEnd;
  U32 UVar24;
  size_t local_c0;
  U32 maxDistance;
  BYTE *litLimit_w;
  int *local_90;
  size_t offsetFound;
  ZSTD_matchState_t *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  uint local_5c;
  BYTE *local_58;
  int *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_78 = (ms->window).base;
  local_68 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  local_70 = local_78 + uVar3;
  local_58 = local_68 + uVar3;
  local_40 = local_68 + (ms->window).lowLimit;
  UVar24 = *rep;
  ip = (int *)((ulong)(local_70 == (BYTE *)src) + (long)src);
  uVar6 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iEnd = (BYTE *)((long)src + srcSize);
  local_50 = (int *)((long)src + (srcSize - 8));
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  iVar7 = uVar3 - 1;
  local_80 = ms;
  uVar8 = rep[1];
  piVar1 = (int *)src;
  local_38 = rep;
LAB_005a97f9:
  do {
    local_48 = piVar1;
    local_5c = uVar8;
    if (local_50 <= ip) {
      *local_38 = UVar24;
      local_38[1] = local_5c;
      return (long)iEnd - (long)local_48;
    }
    iVar23 = (int)ip - (int)local_78;
    iVar9 = iVar23 + 1;
    UVar22 = (local_80->window).lowLimit;
    UVar15 = iVar9 - uVar6;
    if (iVar9 - UVar22 <= uVar6) {
      UVar15 = UVar22;
    }
    if (local_80->loadedDictEnd != 0) {
      UVar15 = UVar22;
    }
    uVar8 = iVar9 - UVar24;
    pBVar13 = local_68;
    if (uVar3 <= uVar8) {
      pBVar13 = local_78;
    }
    if (iVar7 - uVar8 < 3) {
LAB_005a98a1:
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      if (UVar24 < (iVar23 - UVar15) + 1) {
        if (*(int *)((long)ip + 1) != *(int *)(pBVar13 + uVar8)) goto LAB_005a98a1;
        pBVar18 = local_58;
        if (uVar3 <= uVar8) {
          pBVar18 = iEnd;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar13 + uVar8) + 4),iEnd,
                            pBVar18,local_70);
        uVar20 = sVar10 + 4;
      }
    }
    offsetFound = 999999999;
    sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_80,(BYTE *)ip,iEnd,&offsetFound);
    uVar12 = uVar20;
    if (uVar20 < sVar10) {
      uVar12 = sVar10;
    }
    if (uVar12 < 4) {
      ip = (int *)((long)ip + ((long)ip - (long)local_48 >> 8) + 1);
      uVar8 = local_5c;
      piVar1 = local_48;
      goto LAB_005a97f9;
    }
    piVar1 = ip;
    sVar11 = offsetFound;
    if (sVar10 <= uVar20) {
      piVar1 = (int *)((long)ip + 1);
      sVar11 = 0;
    }
LAB_005a990d:
    do {
      iVar9 = iVar23;
      sVar10 = uVar12;
      local_c0 = sVar11;
      piVar21 = ip;
      local_90 = piVar1;
      if (local_50 <= piVar21) break;
      piVar1 = (int *)((long)piVar21 + 1);
      iVar23 = iVar9 + 1;
      if (local_c0 == 0) {
        local_c0 = 0;
      }
      else {
        UVar22 = (local_80->window).lowLimit;
        UVar15 = iVar23 - uVar6;
        if (iVar23 - UVar22 <= uVar6) {
          UVar15 = UVar22;
        }
        if (local_80->loadedDictEnd != 0) {
          UVar15 = UVar22;
        }
        uVar8 = iVar23 - UVar24;
        pBVar13 = local_78;
        if (uVar8 < uVar3) {
          pBVar13 = local_68;
        }
        if (((2 < iVar7 - uVar8) && (UVar24 < iVar23 - UVar15)) &&
           (*piVar1 == *(int *)(pBVar13 + uVar8))) {
          pBVar18 = iEnd;
          if (uVar8 < uVar3) {
            pBVar18 = local_58;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar21 + 5),(BYTE *)((long)(pBVar13 + uVar8) + 4),iEnd
                              ,pBVar18,local_70);
          if (sVar11 < 0xfffffffffffffffc) {
            uVar16 = (int)local_c0 + 1;
            uVar8 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            if ((int)((uVar8 ^ 0x1f) + (int)sVar10 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
              local_c0 = 0;
              sVar10 = sVar11 + 4;
              local_90 = piVar1;
            }
          }
        }
      }
      offsetFound = 999999999;
      uVar12 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_80,(BYTE *)piVar1,iEnd,&offsetFound);
      if (3 < uVar12) {
        uVar16 = (int)local_c0 + 1;
        uVar8 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar16 = (int)offsetFound + 1;
        iVar4 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        ip = piVar1;
        sVar11 = offsetFound;
        if ((int)((uVar8 ^ 0x1f) + (int)sVar10 * 4 + -0x1b) < (int)uVar12 * 4 - iVar4)
        goto LAB_005a990d;
      }
      if (local_50 <= piVar1) break;
      piVar1 = (int *)((long)piVar21 + 2);
      iVar23 = iVar9 + 2;
      if (local_c0 == 0) {
        local_c0 = 0;
      }
      else {
        UVar22 = (local_80->window).lowLimit;
        UVar15 = iVar23 - uVar6;
        if (iVar23 - UVar22 <= uVar6) {
          UVar15 = UVar22;
        }
        if (local_80->loadedDictEnd != 0) {
          UVar15 = UVar22;
        }
        uVar8 = iVar23 - UVar24;
        pBVar13 = local_78;
        if (uVar8 < uVar3) {
          pBVar13 = local_68;
        }
        if (((2 < iVar7 - uVar8) && (UVar24 < iVar23 - UVar15)) &&
           (*piVar1 == *(int *)(pBVar13 + uVar8))) {
          pBVar18 = iEnd;
          if (uVar8 < uVar3) {
            pBVar18 = local_58;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar21 + 6),(BYTE *)((long)(pBVar13 + uVar8) + 4),iEnd
                              ,pBVar18,local_70);
          if (sVar11 < 0xfffffffffffffffc) {
            uVar16 = (int)local_c0 + 1;
            uVar8 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            if ((int)((uVar8 ^ 0x1f) + (int)sVar10 * 4 + -0x1e) < (int)(sVar11 + 4) * 4) {
              local_c0 = 0;
              sVar10 = sVar11 + 4;
              local_90 = piVar1;
            }
          }
        }
      }
      offsetFound = 999999999;
      uVar12 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_80,(BYTE *)piVar1,iEnd,&offsetFound);
      if (uVar12 < 4) break;
      uVar16 = (int)local_c0 + 1;
      uVar8 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar16 = (int)offsetFound + 1;
      iVar9 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      ip = piVar1;
      sVar11 = offsetFound;
    } while ((int)((uVar8 ^ 0x1f) + (int)sVar10 * 4 + -0x18) < (int)uVar12 * 4 - iVar9);
    if (local_c0 == 0) {
      UVar22 = 1;
      uVar16 = UVar24;
      UVar24 = local_5c;
    }
    else {
      pBVar17 = (BYTE *)((long)local_90 + (-(long)local_78 - local_c0) + 2);
      pBVar18 = local_70;
      pBVar13 = local_78;
      if ((uint)pBVar17 < uVar3) {
        pBVar18 = local_40;
        pBVar13 = local_68;
      }
      pBVar13 = pBVar13 + ((ulong)pBVar17 & 0xffffffff);
      for (; ((local_48 < local_90 && (pBVar18 < pBVar13)) &&
             (*(BYTE *)((long)local_90 + -1) == pBVar13[-1]));
          local_90 = (int *)((long)local_90 + -1)) {
        pBVar13 = pBVar13 + -1;
        sVar10 = sVar10 + 1;
      }
      UVar22 = (int)local_c0 + 1;
      uVar16 = (int)local_c0 - 2;
    }
    uVar20 = (long)local_90 - (long)local_48;
    pBVar13 = seqStore->lit;
    if (ilimit_w < local_90) {
      ZSTD_safecopyLiterals(pBVar13,(BYTE *)local_48,(BYTE *)local_90,(BYTE *)ilimit_w);
LAB_005a9c63:
      seqStore->lit = seqStore->lit + uVar20;
      psVar14 = seqStore->sequences;
      if (0xffff < uVar20) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)(local_48 + 2);
      *(undefined8 *)pBVar13 = *(undefined8 *)local_48;
      *(undefined8 *)(pBVar13 + 8) = uVar5;
      pBVar13 = seqStore->lit;
      if (0x10 < uVar20) {
        uVar5 = *(undefined8 *)(local_48 + 6);
        *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(local_48 + 4);
        *(undefined8 *)(pBVar13 + 0x18) = uVar5;
        if (0x20 < (long)uVar20) {
          lVar19 = 0;
          do {
            puVar2 = (undefined8 *)((long)local_48 + lVar19 + 0x20);
            uVar5 = puVar2[1];
            pBVar18 = pBVar13 + lVar19 + 0x20;
            *(undefined8 *)pBVar18 = *puVar2;
            *(undefined8 *)(pBVar18 + 8) = uVar5;
            puVar2 = (undefined8 *)((long)local_48 + lVar19 + 0x30);
            uVar5 = puVar2[1];
            *(undefined8 *)(pBVar18 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar18 + 0x18) = uVar5;
            lVar19 = lVar19 + 0x20;
          } while (pBVar18 + 0x20 < pBVar13 + uVar20);
        }
        goto LAB_005a9c63;
      }
      seqStore->lit = pBVar13 + uVar20;
      psVar14 = seqStore->sequences;
    }
    psVar14->litLength = (U16)uVar20;
    psVar14->offset = UVar22;
    if (0xffff < sVar10 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar14->matchLength = (U16)(sVar10 - 3);
    seqStore->sequences = psVar14 + 1;
    uVar8 = UVar24;
    for (ip = (int *)((long)local_90 + sVar10); UVar24 = uVar16, piVar1 = ip, ip <= local_50;
        ip = (int *)((long)ip + sVar10 + 4)) {
      iVar9 = (int)ip - (int)local_78;
      UVar22 = (local_80->window).lowLimit;
      UVar15 = iVar9 - uVar6;
      if (iVar9 - UVar22 <= uVar6) {
        UVar15 = UVar22;
      }
      if (local_80->loadedDictEnd != 0) {
        UVar15 = UVar22;
      }
      uVar16 = iVar9 - uVar8;
      pBVar13 = local_78;
      if (uVar16 < uVar3) {
        pBVar13 = local_68;
      }
      if (((iVar7 - uVar16 < 3) || (iVar9 - UVar15 <= uVar8)) || (*ip != *(int *)(pBVar13 + uVar16))
         ) break;
      pBVar18 = iEnd;
      if (uVar16 < uVar3) {
        pBVar18 = local_58;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar13 + uVar16) + 4),iEnd,pBVar18,
                          local_70);
      pBVar13 = seqStore->lit;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar13,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar13 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar13 + 8) = uVar5;
      }
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offset = 1;
      if (0xffff < sVar10 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->matchLength = (U16)(sVar10 + 1);
      seqStore->sequences = psVar14 + 1;
      uVar16 = uVar8;
      uVar8 = UVar24;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}